

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool tinyxml2::XMLUtil::ToInt(char *str,int *value)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint v;
  int local_1c;
  
  bVar1 = *str;
  pcVar3 = str;
  while ((-1 < (char)bVar1 && (iVar2 = isspace((uint)bVar1), iVar2 != 0))) {
    bVar1 = pcVar3[1];
    pcVar3 = pcVar3 + 1;
  }
  if ((*pcVar3 == '0') && ((pcVar3[1] & 0xdfU) == 0x58)) {
    iVar2 = __isoc99_sscanf(str,"%x",&local_1c);
    if (iVar2 == 1) {
      *value = local_1c;
      return true;
    }
  }
  else {
    iVar2 = __isoc99_sscanf(str,"%d",value);
    if (iVar2 == 1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLUtil::ToInt(const char* str, int* value)
{
    if (IsPrefixHex(str)) {
        unsigned v;
        if (TIXML_SSCANF(str, "%x", &v) == 1) {
            *value = static_cast<int>(v);
            return true;
        }
    }
    else {
        if (TIXML_SSCANF(str, "%d", value) == 1) {
            return true;
        }
    }
    return false;
}